

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombinationApprovals.h
# Opt level: O0

void ApprovalTests::
     TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verifyAllCombinations<DOCTEST_ANON_FUNC_6()::__0,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>
               (Options *options,string *header,anon_class_1_0_00000001_for_converter *converter,
               vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *input0,
               vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *inputs)

{
  uchar *in_RCX;
  size_t siglen;
  uchar *in_RDI;
  size_t in_R8;
  stringstream s;
  string *in_stack_fffffffffffffe08;
  ostream *in_stack_fffffffffffffe10;
  stringstream local_1b0 [64];
  vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *in_stack_fffffffffffffe90;
  vector<StringMakerPrintable,_std::allocator<StringMakerPrintable>_> *in_stack_fffffffffffffe98;
  serialize<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_approvals[P]ApprovalTests_tests_DocTest_Tests_CustomizingToStringTests_cpp:69:9)>
  *in_stack_fffffffffffffea0;
  
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  ApprovalUtils::writeHeader(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  CartesianProduct::
  cartesian_product<ApprovalTests::TCombinationApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::serialize<DOCTEST_ANON_FUNC_6()::__0>,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>,std::vector<StringMakerPrintable,std::allocator<StringMakerPrintable>>>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  ::std::__cxx11::stringstream::str();
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
            ((EVP_PKEY_CTX *)&stack0xfffffffffffffe10,in_RDI,siglen,in_RCX,in_R8);
  ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffe10);
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

static void verifyAllCombinations(const Options& options,
                                          const std::string& header,
                                          Converter&& converter,
                                          const Container& input0,
                                          const Containers&... inputs)
        {
            std::stringstream s;
            ApprovalUtils::writeHeader(s, header);
            CartesianProduct::cartesian_product(
                serialize<Converter>{s, std::forward<Converter>(converter)},
                input0,
                inputs...);
            Approvals::verify(s.str(), options);
        }